

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Type * find_typedef(C_Parser *parser,C_Token *tok)

{
  C_VarScope *pCVar1;
  C_Type *pCVar2;
  
  if (tok->kind != TK_IDENT) {
    return (C_Type *)0x0;
  }
  pCVar1 = find_var(parser,tok);
  if (pCVar1 == (C_VarScope *)0x0) {
    pCVar2 = (C_Type *)0x0;
  }
  else {
    pCVar2 = pCVar1->type_def;
  }
  return pCVar2;
}

Assistant:

static C_Type *find_typedef(C_Parser *parser, C_Token *tok) {
  if (tok->kind == TK_IDENT) {
    C_VarScope *sc = find_var(parser, tok);
    if (sc)
      return sc->type_def;
  }
  return NULL;
}